

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall
amrex::AmrLevel::LevelDirectoryNames(AmrLevel *this,string *dir,string *LevelDir,string *FullPath)

{
  ulong uVar1;
  char *pcVar2;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  int in_stack_00000150;
  int in_stack_00000154;
  string *in_stack_00000158;
  allocator local_61;
  string local_60 [32];
  string local_40 [32];
  string *local_20;
  string *local_18;
  string *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Level_",&local_61);
  Concatenate(in_stack_00000158,in_stack_00000154,in_stack_00000150);
  std::__cxx11::string::operator=(local_18,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::operator=(local_20,local_10);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 != '/') {
      std::__cxx11::string::operator+=(local_20,'/');
    }
  }
  std::__cxx11::string::operator+=(local_20,local_18);
  return;
}

Assistant:

void
AmrLevel::LevelDirectoryNames (const std::string &dir,
                               std::string &LevelDir,
                               std::string &FullPath)
{
    LevelDir = amrex::Concatenate("Level_", level, 1);
    //
    // Now for the full pathname of that directory.
    //
    FullPath = dir;
    if( ! FullPath.empty() && FullPath.back() != '/') {
        FullPath += '/';
    }
    FullPath += LevelDir;
}